

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx::OrientedDiscMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  undefined4 uVar16;
  RayHitK<4> *pRVar17;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar36;
  float fVar37;
  undefined1 auVar35 [16];
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [64];
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 *local_1f8;
  void *local_1f0;
  RTCRayQueryContext *local_1e8;
  RayHitK<4> *local_1e0;
  undefined1 (*local_1d8) [16];
  undefined4 local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  ulong uVar18;
  undefined1 auVar43 [64];
  
  pSVar8 = context->scene;
  uVar18 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar9->time_range).lower;
  fVar1 = pGVar9->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar9->time_range).upper - fVar1));
  auVar26 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar26 = vminss_avx(auVar26,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar41 = vmaxss_avx(ZEXT816(0) << 0x20,auVar26);
  iVar19 = (int)auVar41._0_4_;
  lVar21 = *(long *)&pGVar9[2].numPrimitives;
  lVar25 = (long)iVar19 * 0x38;
  lVar10 = *(long *)(lVar21 + lVar25);
  lVar24 = *(long *)(lVar21 + 0x10 + lVar25);
  auVar26 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar18);
  uVar23 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar32 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar23);
  uVar20 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar30 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar20);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar27 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar22);
  p_Var11 = pGVar9[2].intersectionFilterN;
  lVar10 = *(long *)(p_Var11 + lVar25);
  lVar24 = *(long *)(p_Var11 + lVar25 + 0x10);
  auVar31 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar18);
  auVar28 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar23);
  auVar35 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar20);
  auVar40 = *(undefined1 (*) [16])(lVar10 + lVar24 * uVar22);
  lVar24 = (long)(iVar19 + 1) * 0x38;
  lVar10 = *(long *)(lVar21 + lVar24);
  lVar21 = *(long *)(lVar21 + 0x10 + lVar24);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar21 * uVar18);
  auVar39 = *(undefined1 (*) [16])(lVar10 + lVar21 * uVar23);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar21 * uVar20);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar21 * uVar22);
  lVar21 = *(long *)(p_Var11 + lVar24);
  lVar10 = *(long *)(p_Var11 + lVar24 + 0x10);
  auVar29 = *(undefined1 (*) [16])(lVar21 + uVar18 * lVar10);
  auVar33 = *(undefined1 (*) [16])(lVar21 + uVar23 * lVar10);
  fVar1 = fVar1 - auVar41._0_4_;
  auVar42 = vunpcklps_avx(auVar26,auVar30);
  auVar41 = vunpckhps_avx(auVar26,auVar30);
  auVar26 = vunpcklps_avx(auVar32,auVar27);
  local_1a8 = vunpckhps_avx(auVar32,auVar27);
  auVar13 = vunpcklps_avx(auVar42,auVar26);
  auVar30 = vunpckhps_avx(auVar42,auVar26);
  auVar42 = vunpcklps_avx(auVar31,auVar35);
  auVar32 = vunpckhps_avx(auVar31,auVar35);
  auVar31 = vunpcklps_avx(auVar28,auVar40);
  auVar27 = vunpckhps_avx(auVar28,auVar40);
  auVar26 = *(undefined1 (*) [16])(lVar21 + uVar20 * lVar10);
  auVar40 = vunpcklps_avx(auVar32,auVar27);
  auVar14 = vunpcklps_avx(auVar42,auVar31);
  auVar27 = vunpckhps_avx(auVar42,auVar31);
  auVar32 = vunpcklps_avx(auVar51,auVar54);
  auVar28 = vunpckhps_avx(auVar51,auVar54);
  auVar31 = vunpcklps_avx(auVar39,auVar55);
  local_e8 = vunpckhps_avx(auVar39,auVar55);
  auVar51 = vunpcklps_avx(auVar32,auVar31);
  auVar31 = vunpckhps_avx(auVar32,auVar31);
  auVar35 = vunpcklps_avx(auVar29,auVar26);
  auVar32 = vunpckhps_avx(auVar29,auVar26);
  auVar26 = *(undefined1 (*) [16])(lVar21 + lVar10 * uVar22);
  auVar39 = vunpcklps_avx(auVar33,auVar26);
  auVar26 = vunpckhps_avx(auVar33,auVar26);
  auVar54 = vunpcklps_avx(auVar32,auVar26);
  auVar55 = vunpcklps_avx(auVar35,auVar39);
  auVar35 = vunpckhps_avx(auVar35,auVar39);
  auVar26 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar32 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar45 = auVar26._0_4_;
  fVar47 = auVar26._4_4_;
  fVar48 = auVar26._8_4_;
  fVar49 = auVar26._12_4_;
  fVar34 = auVar32._0_4_;
  fVar36 = auVar32._4_4_;
  fVar37 = auVar32._8_4_;
  fVar38 = auVar32._12_4_;
  auVar39._0_4_ = fVar34 * auVar13._0_4_ + fVar45 * auVar51._0_4_;
  auVar39._4_4_ = fVar36 * auVar13._4_4_ + fVar47 * auVar51._4_4_;
  auVar39._8_4_ = fVar37 * auVar13._8_4_ + fVar48 * auVar51._8_4_;
  auVar39._12_4_ = fVar38 * auVar13._12_4_ + fVar49 * auVar51._12_4_;
  auVar51._0_4_ = fVar34 * auVar30._0_4_ + fVar45 * auVar31._0_4_;
  auVar51._4_4_ = fVar36 * auVar30._4_4_ + fVar47 * auVar31._4_4_;
  auVar51._8_4_ = fVar37 * auVar30._8_4_ + fVar48 * auVar31._8_4_;
  auVar51._12_4_ = fVar38 * auVar30._12_4_ + fVar49 * auVar31._12_4_;
  local_f8 = fVar34 * auVar14._0_4_ + fVar45 * auVar55._0_4_;
  fStack_f4 = fVar36 * auVar14._4_4_ + fVar47 * auVar55._4_4_;
  fStack_f0 = fVar37 * auVar14._8_4_ + fVar48 * auVar55._8_4_;
  fStack_ec = fVar38 * auVar14._12_4_ + fVar49 * auVar55._12_4_;
  local_218._0_4_ = auVar27._0_4_;
  local_218._4_4_ = auVar27._4_4_;
  fStack_210 = auVar27._8_4_;
  fStack_20c = auVar27._12_4_;
  local_108 = fVar34 * (float)local_218._0_4_ + fVar45 * auVar35._0_4_;
  fStack_104 = fVar36 * (float)local_218._4_4_ + fVar47 * auVar35._4_4_;
  fStack_100 = fVar37 * fStack_210 + fVar48 * auVar35._8_4_;
  fStack_fc = fVar38 * fStack_20c + fVar49 * auVar35._12_4_;
  local_208._0_4_ = auVar40._0_4_;
  local_208._4_4_ = auVar40._4_4_;
  fStack_200 = auVar40._8_4_;
  fStack_1fc = auVar40._12_4_;
  local_118 = fVar34 * (float)local_208._0_4_ + fVar45 * auVar54._0_4_;
  fStack_114 = fVar36 * (float)local_208._4_4_ + fVar47 * auVar54._4_4_;
  fStack_110 = fVar37 * fStack_200 + fVar48 * auVar54._8_4_;
  fStack_10c = fVar38 * fStack_1fc + fVar49 * auVar54._12_4_;
  local_d8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar26._0_4_ = fVar1 * local_f8 + local_108 * fVar2 + local_118 * fVar3;
  auVar26._4_4_ = fVar1 * fStack_f4 + fStack_104 * fVar2 + fStack_114 * fVar3;
  auVar26._8_4_ = fVar1 * fStack_f0 + fStack_100 * fVar2 + fStack_110 * fVar3;
  auVar26._12_4_ = fVar1 * fStack_ec + fStack_fc * fVar2 + fStack_10c * fVar3;
  auVar32 = vcmpps_avx(auVar26,ZEXT416(0) << 0x20,4);
  auVar30._8_4_ = 0x3f800000;
  auVar30._0_8_ = 0x3f8000003f800000;
  auVar30._12_4_ = 0x3f800000;
  auVar26 = vblendvps_avx(auVar30,auVar26,auVar32);
  auVar30 = vunpcklps_avx(auVar28,local_e8);
  auVar27 = vunpcklps_avx(auVar41,local_1a8);
  auVar54._0_4_ = fVar34 * auVar27._0_4_ + fVar45 * auVar30._0_4_;
  auVar54._4_4_ = fVar36 * auVar27._4_4_ + fVar47 * auVar30._4_4_;
  auVar54._8_4_ = fVar37 * auVar27._8_4_ + fVar48 * auVar30._8_4_;
  auVar54._12_4_ = fVar38 * auVar27._12_4_ + fVar49 * auVar30._12_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x20);
  auVar55._4_4_ = fVar4;
  auVar55._0_4_ = fVar4;
  auVar55._8_4_ = fVar4;
  auVar55._12_4_ = fVar4;
  auVar30 = vsubps_avx(auVar54,auVar55);
  fVar5 = *(float *)(ray + k * 4 + 0x10);
  auVar27._4_4_ = fVar5;
  auVar27._0_4_ = fVar5;
  auVar27._8_4_ = fVar5;
  auVar27._12_4_ = fVar5;
  auVar27 = vsubps_avx(auVar51,auVar27);
  fVar6 = *(float *)(ray + k * 4);
  auVar31._4_4_ = fVar6;
  auVar31._0_4_ = fVar6;
  auVar31._8_4_ = fVar6;
  auVar31._12_4_ = fVar6;
  auVar31 = vsubps_avx(auVar39,auVar31);
  auVar40._0_4_ = auVar31._0_4_ * local_f8 + local_108 * auVar27._0_4_ + local_118 * auVar30._0_4_;
  auVar40._4_4_ =
       auVar31._4_4_ * fStack_f4 + fStack_104 * auVar27._4_4_ + fStack_114 * auVar30._4_4_;
  auVar40._8_4_ =
       auVar31._8_4_ * fStack_f0 + fStack_100 * auVar27._8_4_ + fStack_110 * auVar30._8_4_;
  auVar40._12_4_ =
       auVar31._12_4_ * fStack_ec + fStack_fc * auVar27._12_4_ + fStack_10c * auVar30._12_4_;
  local_158 = vdivps_avx(auVar40,auVar26);
  auVar44 = ZEXT1664(local_158);
  uVar16 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar35._4_4_ = uVar16;
  auVar35._0_4_ = uVar16;
  auVar35._8_4_ = uVar16;
  auVar35._12_4_ = uVar16;
  auVar26 = vcmpps_avx(auVar35,local_158,2);
  uVar16 = *(undefined4 *)(ray + k * 4 + 0x80);
  local_1b8._4_4_ = uVar16;
  local_1b8._0_4_ = uVar16;
  local_1b8._8_4_ = uVar16;
  local_1b8._12_4_ = uVar16;
  auVar30 = vcmpps_avx(local_158,local_1b8,2);
  auVar26 = vandps_avx(auVar30,auVar26);
  auVar30 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar30 = vpcmpgtd_avx(auVar30,_DAT_01f7fcf0);
  auVar26 = vandps_avx(auVar26,auVar30);
  auVar30 = auVar32 & auVar26;
  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0') {
    auVar26 = vandps_avx(auVar26,auVar32);
    auVar32 = vunpckhps_avx(auVar41,local_1a8);
    auVar30 = vunpckhps_avx(auVar28,local_e8);
    fVar34 = fVar34 * auVar32._0_4_ + fVar45 * auVar30._0_4_;
    fVar36 = fVar36 * auVar32._4_4_ + fVar47 * auVar30._4_4_;
    fVar37 = fVar37 * auVar32._8_4_ + fVar48 * auVar30._8_4_;
    fVar38 = fVar38 * auVar32._12_4_ + fVar49 * auVar30._12_4_;
    fVar45 = local_158._0_4_;
    fVar47 = local_158._4_4_;
    fVar48 = local_158._8_4_;
    fVar49 = local_158._12_4_;
    auVar32._0_4_ = fVar6 + fVar1 * fVar45;
    auVar32._4_4_ = fVar6 + fVar1 * fVar47;
    auVar32._8_4_ = fVar6 + fVar1 * fVar48;
    auVar32._12_4_ = fVar6 + fVar1 * fVar49;
    auVar28._0_4_ = fVar5 + fVar2 * fVar45;
    auVar28._4_4_ = fVar5 + fVar2 * fVar47;
    auVar28._8_4_ = fVar5 + fVar2 * fVar48;
    auVar28._12_4_ = fVar5 + fVar2 * fVar49;
    auVar41._0_4_ = fVar4 + fVar45 * fVar3;
    auVar41._4_4_ = fVar4 + fVar47 * fVar3;
    auVar41._8_4_ = fVar4 + fVar48 * fVar3;
    auVar41._12_4_ = fVar4 + fVar49 * fVar3;
    auVar32 = vsubps_avx(auVar32,auVar39);
    auVar30 = vsubps_avx(auVar28,auVar51);
    auVar27 = vsubps_avx(auVar41,auVar54);
    auVar29._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar30._0_4_ * auVar30._0_4_ + auVar27._0_4_ * auVar27._0_4_;
    auVar29._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar30._4_4_ * auVar30._4_4_ + auVar27._4_4_ * auVar27._4_4_;
    auVar29._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar30._8_4_ * auVar30._8_4_ + auVar27._8_4_ * auVar27._8_4_;
    auVar29._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar30._12_4_ * auVar30._12_4_ + auVar27._12_4_ * auVar27._12_4_;
    auVar33._0_4_ = fVar34 * fVar34;
    auVar33._4_4_ = fVar36 * fVar36;
    auVar33._8_4_ = fVar37 * fVar37;
    auVar33._12_4_ = fVar38 * fVar38;
    auVar32 = vcmpps_avx(auVar29,auVar33,1);
    auVar30 = auVar26 & auVar32;
    if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0')
    {
      local_238 = vandps_avx(auVar32,auVar26);
      local_178 = ZEXT832(0) << 0x20;
      local_148 = CONCAT44(fStack_f4,local_f8);
      uStack_140 = CONCAT44(fStack_ec,fStack_f0);
      local_138 = CONCAT44(fStack_104,local_108);
      uStack_130 = CONCAT44(fStack_fc,fStack_100);
      local_128 = CONCAT44(fStack_114,local_118);
      uStack_120 = CONCAT44(fStack_10c,fStack_110);
      auVar42._8_4_ = 0x7f800000;
      auVar42._0_8_ = 0x7f8000007f800000;
      auVar42._12_4_ = 0x7f800000;
      auVar43 = ZEXT1664(auVar42);
      auVar26 = vblendvps_avx(auVar42,local_158,local_238);
      auVar32 = vshufps_avx(auVar26,auVar26,0xb1);
      auVar32 = vminps_avx(auVar32,auVar26);
      auVar30 = vshufpd_avx(auVar32,auVar32,1);
      auVar32 = vminps_avx(auVar30,auVar32);
      auVar32 = vcmpps_avx(auVar26,auVar32,0);
      auVar30 = local_238 & auVar32;
      auVar26 = local_238;
      if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar30[0xf] < '\0'
         ) {
        auVar26 = vandps_avx(auVar32,local_238);
      }
      uVar15 = vmovmskps_avx(auVar26);
      lVar21 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
        }
      }
      auVar12 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar46 = ZEXT3264(auVar12);
      auVar50 = ZEXT864(0) << 0x20;
      auVar26 = vpcmpeqd_avx(auVar51,auVar51);
      auVar52 = ZEXT1664(auVar26);
      auVar53 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      _local_218 = auVar51;
      _local_208 = auVar39;
      do {
        local_1d8 = &local_c8;
        local_1f8 = local_228;
        uVar15 = *(uint *)(local_d8 + lVar21 * 4);
        pRVar17 = (RayHitK<4> *)(ulong)uVar15;
        pGVar9 = (pSVar8->geometries).items[(long)pRVar17].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_238 + lVar21 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar16 = *(undefined4 *)(local_178 + lVar21 * 4);
            uVar7 = *(undefined4 *)(local_178 + lVar21 * 4 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_148 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_138 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_128 + lVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar16;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar21];
            *(uint *)(ray + k * 4 + 0x120) = uVar15;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_98 = *(undefined4 *)(local_178 + lVar21 * 4);
          local_88 = *(undefined4 *)(local_178 + lVar21 * 4 + 0x10);
          local_68 = vpshufd_avx(ZEXT416(uVar15),0);
          local_78 = (Disc->primIDs).field_0.i[lVar21];
          uVar16 = *(undefined4 *)((long)&local_148 + lVar21 * 4);
          local_c8._4_4_ = uVar16;
          local_c8._0_4_ = uVar16;
          local_c8._8_4_ = uVar16;
          local_c8._12_4_ = uVar16;
          uVar16 = *(undefined4 *)((long)&local_138 + lVar21 * 4);
          local_b8._4_4_ = uVar16;
          local_b8._0_4_ = uVar16;
          local_b8._8_4_ = uVar16;
          local_b8._12_4_ = uVar16;
          uVar16 = *(undefined4 *)((long)&local_128 + lVar21 * 4);
          local_a8._4_4_ = uVar16;
          local_a8._0_4_ = uVar16;
          local_a8._8_4_ = uVar16;
          local_a8._12_4_ = uVar16;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          local_198 = auVar46._0_32_;
          uStack_54 = context->user->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = context->user->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + lVar21 * 4);
          local_228 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_1f0 = pGVar9->userPtr;
          local_1e8 = context->user;
          local_1d0 = 4;
          pRVar17 = (RayHitK<4> *)pGVar9->intersectionFilterN;
          local_1c8 = auVar44._0_16_;
          auVar26 = auVar53._0_16_;
          local_1e0 = ray;
          if (pRVar17 != (RayHitK<4> *)0x0) {
            auVar32 = auVar52._0_16_;
            pRVar17 = (RayHitK<4> *)(*(code *)pRVar17)(&local_1f8);
            auVar53 = ZEXT1664(auVar26);
            auVar32 = vpcmpeqd_avx(auVar32,auVar32);
            auVar52 = ZEXT1664(auVar32);
            auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar46 = ZEXT3264(local_198);
            auVar43 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar44 = ZEXT1664(local_1c8);
          }
          auVar32 = auVar52._0_16_;
          if (local_228 == (undefined1  [16])0x0) {
            auVar26 = vpcmpeqd_avx(auVar50._0_16_,(undefined1  [16])0x0);
            auVar32 = auVar32 ^ auVar26;
          }
          else {
            pRVar17 = (RayHitK<4> *)context->args->filter;
            if ((pRVar17 != (RayHitK<4> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              pRVar17 = (RayHitK<4> *)(*(code *)pRVar17)(&local_1f8);
              auVar53 = ZEXT1664(auVar26);
              auVar26 = vpcmpeqd_avx(auVar32,auVar32);
              auVar52 = ZEXT1664(auVar26);
              auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar46 = ZEXT3264(local_198);
              auVar43 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar44 = ZEXT1664(local_1c8);
            }
            auVar26 = vpcmpeqd_avx(auVar50._0_16_,local_228);
            auVar32 = auVar52._0_16_ ^ auVar26;
            if (local_228 != (undefined1  [16])0x0) {
              auVar26 = auVar52._0_16_ ^ auVar26;
              auVar30 = vmaskmovps_avx(auVar26,*local_1d8);
              *(undefined1 (*) [16])(local_1e0 + 0xc0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[1]);
              *(undefined1 (*) [16])(local_1e0 + 0xd0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[2]);
              *(undefined1 (*) [16])(local_1e0 + 0xe0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[3]);
              *(undefined1 (*) [16])(local_1e0 + 0xf0) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[4]);
              *(undefined1 (*) [16])(local_1e0 + 0x100) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[5]);
              *(undefined1 (*) [16])(local_1e0 + 0x110) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[6]);
              *(undefined1 (*) [16])(local_1e0 + 0x120) = auVar30;
              auVar30 = vmaskmovps_avx(auVar26,local_1d8[7]);
              *(undefined1 (*) [16])(local_1e0 + 0x130) = auVar30;
              auVar26 = vmaskmovps_avx(auVar26,local_1d8[8]);
              *(undefined1 (*) [16])(local_1e0 + 0x140) = auVar26;
              pRVar17 = local_1e0;
            }
          }
          if ((auVar53._0_16_ & auVar32) == (undefined1  [16])0x0) {
            *(int *)(ray + k * 4 + 0x80) = local_1b8._0_4_;
            auVar26 = local_1b8;
          }
          else {
            auVar26 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
          }
          *(undefined4 *)(local_238 + lVar21 * 4) = 0;
          auVar32 = vshufps_avx(auVar26,auVar26,0);
          auVar32 = vcmpps_avx(auVar44._0_16_,auVar32,2);
          local_238 = vandps_avx(auVar32,local_238);
          local_1b8 = auVar26;
        }
        if ((((local_238 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_238 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_238 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_238[0xf]) {
          return;
        }
        auVar26 = vblendvps_avx(auVar43._0_16_,auVar44._0_16_,local_238);
        auVar32 = vshufps_avx(auVar26,auVar26,0xb1);
        auVar32 = vminps_avx(auVar32,auVar26);
        auVar30 = vshufpd_avx(auVar32,auVar32,1);
        auVar32 = vminps_avx(auVar30,auVar32);
        auVar32 = vcmpps_avx(auVar26,auVar32,0);
        auVar30 = local_238 & auVar32;
        auVar26 = local_238;
        if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar30[0xf] < '\0') {
          auVar26 = vandps_avx(auVar32,local_238);
        }
        uVar16 = vmovmskps_avx(auVar26);
        uVar18 = CONCAT44((int)((ulong)pRVar17 >> 0x20),uVar16);
        lVar21 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }